

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mip_level::pack_to_dxt
          (mip_level *this,image_u8 *img,pixel_format fmt,bool cook,pack_params *orig_params,
          orientation_flags_t orient_flags)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  component_flags cVar4;
  dxt_format dVar5;
  uint uVar6;
  dxt_image *this_00;
  byte in_CL;
  pixel_format in_EDX;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RSI;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  void *in_R8;
  dxt_image *pDXT_image;
  dxt_format dxt_fmt;
  image_u8 tmp_img;
  pack_params p;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  mip_level *in_stack_ffffffffffffff30;
  dxt_format dVar7;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_ffffffffffffff50;
  undefined1 local_68 [16];
  undefined1 local_58;
  void *local_28;
  byte local_1d;
  pixel_format local_1c;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_18;
  byte local_1;
  
  local_1d = in_CL & 1;
  local_28 = in_R8;
  local_1c = in_EDX;
  local_18 = in_RSI;
  iVar3 = pixel_format_helpers::is_dxt(in_EDX);
  if (iVar3 == 0) {
    local_1 = 0;
  }
  else {
    memcpy(local_68,local_28,0x38);
    bVar1 = pixel_format_helpers::is_pixel_format_non_srgb(local_1c);
    if (((bVar1) ||
        (cVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(local_18),
        (cVar4 & cCompFlagNormalMap) != 0)) ||
       (cVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(local_18),
       (cVar4 & cCompFlagLumaChroma) != 0)) {
      local_58 = 0;
    }
    image<crnlib::color_quad<unsigned_char,_int>_>::image
              (in_stack_ffffffffffffff50,
               (image<crnlib::color_quad<unsigned_char,_int>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    clear(in_stack_ffffffffffffff30);
    in_RDI->m_total = local_1c;
    if ((local_1d & 1) != 0) {
      cook_image(in_stack_ffffffffffffff30,
                 (image_u8 *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    }
    uVar2 = pixel_format_helpers::is_alpha_only(local_1c);
    if (((bool)uVar2) &&
       (in_stack_ffffffffffffff3e =
             image<crnlib::color_quad<unsigned_char,_int>_>::has_alpha
                       ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x16792a),
       !(bool)in_stack_ffffffffffffff3e)) {
      image<crnlib::color_quad<unsigned_char,_int>_>::set_alpha_to_luma(in_RDI);
    }
    dVar5 = pixel_format_helpers::get_dxt_format(local_1c);
    dVar7 = dVar5;
    this_00 = crnlib_new<crnlib::dxt_image>();
    uVar6 = dxt_image::init(this_00,(EVP_PKEY_CTX *)(ulong)(uint)dVar5);
    bVar1 = (uVar6 & 1) != 0;
    if (bVar1) {
      assign((mip_level *)in_RDI,
             (dxt_image *)
             CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff3e,
                                     CONCAT24(in_stack_ffffffffffffff3c,dVar7))),
             (pixel_format)((ulong)this_00 >> 0x20),(orientation_flags_t)this_00);
    }
    else {
      clear((mip_level *)this_00);
    }
    local_1 = bVar1;
    image<crnlib::color_quad<unsigned_char,_int>_>::~image
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x1679f7);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool mip_level::pack_to_dxt(const image_u8& img, pixel_format fmt, bool cook, const dxt_image::pack_params& orig_params, orientation_flags_t orient_flags) {
  CRNLIB_ASSERT(pixel_format_helpers::is_dxt(fmt));
  if (!pixel_format_helpers::is_dxt(fmt))
    return false;

  dxt_image::pack_params p(orig_params);
  if (pixel_format_helpers::is_pixel_format_non_srgb(fmt) || (img.get_comp_flags() & pixel_format_helpers::cCompFlagNormalMap) || (img.get_comp_flags() & pixel_format_helpers::cCompFlagLumaChroma)) {
    // Disable perceptual colorspace metrics when packing to swizzled or non-RGB pixel formats.
    p.m_perceptual = false;
  }

  image_u8 tmp_img(img);

  clear();

  m_format = fmt;

  if (cook)
    cook_image(tmp_img);

  if ((pixel_format_helpers::is_alpha_only(fmt)) && (!tmp_img.has_alpha()))
    tmp_img.set_alpha_to_luma();

  dxt_format dxt_fmt = pixel_format_helpers::get_dxt_format(fmt);

  dxt_image* pDXT_image = crnlib_new<dxt_image>();
  if (!pDXT_image->init(dxt_fmt, tmp_img, p)) {
    clear();
    return false;
  }

  assign(pDXT_image, fmt, orient_flags);

  return true;
}